

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O1

int __thiscall
google::protobuf::stringpiece_internal::StringPiece::compare(StringPiece *this,StringPiece x)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong __n;
  
  uVar4 = x.length_;
  uVar1 = this->length_;
  __n = uVar4;
  if (uVar1 < uVar4) {
    __n = uVar1;
  }
  iVar2 = memcmp(this->ptr_,x.ptr_,__n);
  uVar3 = 0xffffffff;
  if (-1 < iVar2) {
    if (uVar1 < uVar4 || iVar2 != 0) {
      uVar3 = (uint)(iVar2 != 0) * 2 - 1;
    }
    else {
      uVar3 = (uint)(uVar4 < uVar1);
    }
  }
  return uVar3;
}

Assistant:

int compare(StringPiece x) const {
    size_type min_size = length_ < x.length_ ? length_ : x.length_;
    int r = memcmp(ptr_, x.ptr_, static_cast<size_t>(min_size));
    if (r < 0) return -1;
    if (r > 0) return 1;
    if (length_ < x.length_) return -1;
    if (length_ > x.length_) return 1;
    return 0;
  }